

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::value::matrix3d> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::matrix3d>
          (optional<tinyusdz::value::matrix3d> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  long lVar3;
  storage_t<tinyusdz::value::matrix3d> *psVar4;
  storage_t<tinyusdz::value::matrix3d> *psVar5;
  bool bVar6;
  byte bVar7;
  optional<tinyusdz::value::matrix3d> local_68;
  
  bVar7 = 0;
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar6 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar6 = uVar2 == 4;
  }
  if (((bVar6) || ((this->_blocked & 1U) != 0)) ||
     ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
      ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))))) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
  }
  else {
    tinyusdz::value::Value::get_value<tinyusdz::value::matrix3d>(&local_68,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_68.has_value_;
    if (local_68.has_value_ == true) {
      psVar4 = &local_68.contained;
      psVar5 = &__return_storage_ptr__->contained;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)psVar5 = *(undefined8 *)psVar4;
        psVar4 = (storage_t<tinyusdz::value::matrix3d> *)
                 ((long)psVar4 + ((ulong)bVar7 * -2 + 1) * 8);
        psVar5 = (storage_t<tinyusdz::value::matrix3d> *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }